

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

int __thiscall QTextBrowserPrivate::init(QTextBrowserPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  void **ppvVar1;
  QWidgetTextControl *pQVar2;
  undefined8 uVar3;
  bool bVar4;
  QTextDocument *pQVar5;
  undefined4 *puVar6;
  unsigned_long __i0;
  long lVar7;
  long in_FS_OFFSET;
  code *local_70;
  ImplFn local_68;
  code *local_60;
  undefined8 local_58;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
              super_QWidgetPrivate.field_0x8;
  QWidgetTextControl::setTextInteractionFlags
            ((QWidgetTextControl *)(this->super_QTextEditPrivate).control,(TextInteractionFlags)0xd)
  ;
  QWidget::setCursor((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport,
                     &this->oldCursor);
  bVar4 = QTextEdit::isReadOnly((QTextEdit *)this_00);
  QWidget::setAttribute(this_00,WA_InputMethodEnabled,!bVar4);
  pQVar5 = QTextEdit::document((QTextEdit *)this_00);
  lVar7 = 0;
  QTextDocument::setUndoRedoEnabled(SUB81(pQVar5,0));
  QWidget::setAttribute
            ((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport,
             WA_MouseTracking,true);
  pQVar5 = QTextEdit::document((QTextEdit *)this_00);
  local_60 = QTextDocument::contentsChanged;
  local_58 = 0;
  local_70 = documentModified;
  local_68 = (ImplFn)0x0;
  ppvVar1 = *(void ***)
             &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
              super_QWidgetPrivate.field_0x8;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTextBrowserPrivate::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar6 + 4) = documentModified;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_60,ppvVar1,(QSlotObjectBase *)&local_70,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = (this->super_QTextEditPrivate).control;
  local_60 = QWidgetTextControl::linkActivated;
  local_58 = 0;
  local_70 = activateAnchor;
  local_68 = (ImplFn)0x0;
  ppvVar1 = *(void ***)
             &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
              super_QWidgetPrivate.field_0x8;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTextBrowserPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar6 + 4) = activateAnchor;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar2,(QObject *)&local_60,ppvVar1,(QSlotObjectBase *)&local_70,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = (this->super_QTextEditPrivate).control;
  local_60 = QWidgetTextControl::linkHovered;
  local_58 = 0;
  local_70 = highlightLink;
  local_68 = (ImplFn)0x0;
  ppvVar1 = *(void ***)
             &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
              super_QWidgetPrivate.field_0x8;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTextBrowserPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar6 + 4) = highlightLink;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar2,(QObject *)&local_60,ppvVar1,(QSlotObjectBase *)&local_70,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  do {
    uVar3 = *(undefined8 *)(&(this->connections).field_0x0 + lVar7 * 8);
    *(undefined8 *)(&(this->connections).field_0x0 + lVar7 * 8) =
         *(undefined8 *)(local_48 + lVar7 * 8 + -8);
    *(undefined8 *)(local_48 + lVar7 * 8 + -8) = uVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 0x10;
  do {
    QMetaObject::Connection::~Connection((Connection *)(local_48 + lVar7 + -8));
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::init()
{
    Q_Q(QTextBrowser);
    control->setTextInteractionFlags(Qt::TextBrowserInteraction);
#ifndef QT_NO_CURSOR
    viewport->setCursor(oldCursor);
#endif
    q->setAttribute(Qt::WA_InputMethodEnabled, shouldEnableInputMethod(q));
    q->setUndoRedoEnabled(false);
    viewport->setMouseTracking(true);
    connections = {
        QObjectPrivate::connect(q->document(), &QTextDocument::contentsChanged,
                                this, &QTextBrowserPrivate::documentModified),
        QObjectPrivate::connect(control, &QWidgetTextControl::linkActivated,
                                this, &QTextBrowserPrivate::activateAnchor),
        QObjectPrivate::connect(control, &QWidgetTextControl::linkHovered,
                                this, &QTextBrowserPrivate::highlightLink),
    };
}